

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

bool __thiscall re2::Compiler::IsCachedRuneByteSuffix(Compiler *this,int id)

{
  bool bVar1;
  int iVar2;
  Inst *pIVar3;
  unordered_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  *in_RDI;
  uint64_t key;
  int next;
  bool foldcase;
  uint8_t hi;
  uint8_t lo;
  _Node_iterator_base<std::pair<const_unsigned_long,_int>,_false> in_stack_ffffffffffffffd0;
  _Node_iterator_base<std::pair<const_unsigned_long,_int>,_false> local_28;
  uint64_t local_20;
  int local_14;
  byte local_f;
  uint8_t local_e;
  uint8_t local_d;
  
  pIVar3 = PODArray<re2::Prog::Inst>::operator[]
                     ((PODArray<re2::Prog::Inst> *)in_stack_ffffffffffffffd0._M_cur,
                      (int)((ulong)in_RDI >> 0x20));
  local_d = (pIVar3->field_1).field_3.lo_;
  pIVar3 = PODArray<re2::Prog::Inst>::operator[]
                     ((PODArray<re2::Prog::Inst> *)in_stack_ffffffffffffffd0._M_cur,
                      (int)((ulong)in_RDI >> 0x20));
  local_e = (pIVar3->field_1).field_3.hi_;
  pIVar3 = PODArray<re2::Prog::Inst>::operator[]
                     ((PODArray<re2::Prog::Inst> *)in_stack_ffffffffffffffd0._M_cur,
                      (int)((ulong)in_RDI >> 0x20));
  iVar2 = Prog::Inst::foldcase(pIVar3);
  local_f = iVar2 != 0;
  pIVar3 = PODArray<re2::Prog::Inst>::operator[]
                     ((PODArray<re2::Prog::Inst> *)in_stack_ffffffffffffffd0._M_cur,
                      (int)((ulong)in_RDI >> 0x20));
  local_14 = Prog::Inst::out(pIVar3);
  local_20 = MakeRuneCacheKey(local_d,local_e,(bool)(local_f & 1),local_14);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
       ::find(in_RDI,(key_type *)0x23a0bd);
  std::
  unordered_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_int>_>_>
  ::end(in_RDI);
  bVar1 = std::__detail::operator!=
                    (&local_28,
                     (_Node_iterator_base<std::pair<const_unsigned_long,_int>,_false> *)
                     &stack0xffffffffffffffd0);
  return bVar1;
}

Assistant:

bool Compiler::IsCachedRuneByteSuffix(int id) {
  uint8_t lo = inst_[id].lo_;
  uint8_t hi = inst_[id].hi_;
  bool foldcase = inst_[id].foldcase() != 0;
  int next = inst_[id].out();

  uint64_t key = MakeRuneCacheKey(lo, hi, foldcase, next);
  return rune_cache_.find(key) != rune_cache_.end();
}